

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality_estimator.hpp
# Opt level: O2

void __thiscall
duckdb::RelationsToTDom::RelationsToTDom
          (RelationsToTDom *this,column_binding_set_t *column_binding_set)

{
  ::std::
  _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable((_Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)this,&column_binding_set->_M_h);
  this->tdom_hll = 0;
  this->tdom_no_hll = 0xffffffffffffffff;
  this->has_tdom_hll = false;
  (this->filters).
  super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
  .
  super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filters).
  super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
  .
  super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filters).
  super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
  .
  super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->column_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

explicit RelationsToTDom(const column_binding_set_t &column_binding_set)
	    : equivalent_relations(column_binding_set), tdom_hll(0), tdom_no_hll(NumericLimits<idx_t>::Maximum()),
	      has_tdom_hll(false) {}